

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O0

int uv__ifaddr_exclude(ifaddrs *ent,int exclude_type)

{
  int exclude_type_local;
  ifaddrs *ent_local;
  
  if (((ent->ifa_flags & 1) == 0) || ((ent->ifa_flags & 0x40) == 0)) {
    ent_local._4_4_ = 1;
  }
  else if (ent->ifa_addr == (sockaddr *)0x0) {
    ent_local._4_4_ = 1;
  }
  else {
    ent_local._4_4_ = exclude_type;
    if (ent->ifa_addr->sa_family != 0x11) {
      ent_local._4_4_ = (uint)((exclude_type != 0 ^ 0xffU) & 1);
    }
  }
  return ent_local._4_4_;
}

Assistant:

static int uv__ifaddr_exclude(struct ifaddrs *ent, int exclude_type) {
  if (!((ent->ifa_flags & IFF_UP) && (ent->ifa_flags & IFF_RUNNING)))
    return 1;
  if (ent->ifa_addr == NULL)
    return 1;
  /*
   * On Linux getifaddrs returns information related to the raw underlying
   * devices. We're not interested in this information yet.
   */
  if (ent->ifa_addr->sa_family == PF_PACKET)
    return exclude_type;
  return !exclude_type;
}